

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssembly.cpp
# Opt level: O2

Var Js::WebAssembly::TryResolveResponse(RecyclableObject *function,Var thisArg,Var responseArg)

{
  ScriptContext *scriptContext;
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  Var aValue;
  undefined4 *puVar4;
  JavascriptPromise *promise;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  bVar3 = IsResponseObject(responseArg,scriptContext);
  if (bVar3) {
    aValue = EntryQueryResponse(function,(CallInfo)0x2000002,0,0,0,0,function,0x2000002,thisArg,
                                responseArg);
  }
  else {
    bVar3 = VarIs<Js::JavascriptPromise>(responseArg);
    if (!bVar3) {
      return (Var)0x0;
    }
    aValue = JavascriptPromise::CreateThenPromise
                       ((JavascriptPromise *)responseArg,
                        (RecyclableObject *)(pJVar1->webAssemblyQueryResponseFunction).ptr,
                        (RecyclableObject *)(pJVar1->throwerFunction).ptr,scriptContext);
  }
  if (aValue == (Var)0x0) {
    return (Var)0x0;
  }
  bVar3 = VarIs<Js::JavascriptPromise>(aValue);
  if (bVar3) {
    return aValue;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar4 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssembly.cpp"
                              ,0x11a,"((0))",
                              "How did we end up with something other than a promise here ?");
  if (bVar3) {
    *puVar4 = 0;
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5e494,(PCWSTR)0x0);
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

Var WebAssembly::TryResolveResponse(RecyclableObject* function, Var thisArg, Var responseArg)
{
    ScriptContext* scriptContext = function->GetScriptContext();
    JavascriptLibrary* library = scriptContext->GetLibrary();
    Var responsePromise = nullptr;
    bool isResponse = IsResponseObject(responseArg, scriptContext);
    if (isResponse)
    {
        CallInfo newCallInfo;
        newCallInfo.Count = 2;
        // We already have a response object, query it now
        responsePromise = CALL_ENTRYPOINT_NOASSERT(EntryQueryResponse, function, Js::CallInfo(CallFlags_Value, 2), thisArg, responseArg);
    }
    else if (VarIs<JavascriptPromise>(responseArg))
    {
        JavascriptPromise* promise = (JavascriptPromise*)responseArg;
        // Wait until this promise resolves and then try to query the response object (if it's a response object)
        responsePromise = JavascriptPromise::CreateThenPromise(promise, library->GetWebAssemblyQueryResponseFunction(), library->GetThrowerFunction(), scriptContext);
    }
    if (responsePromise && !VarIs<JavascriptPromise>(responsePromise))
    {
        AssertMsg(UNREACHED, "How did we end up with something other than a promise here ?");
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedResponse);
    }
    return responsePromise;
}